

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::number::FormattedNumber::toString
          (UnicodeString *__return_storage_ptr__,FormattedNumber *this,UErrorCode *status)

{
  UnicodeString *result;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_003b5258;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      UnicodeString::setToBogus(__return_storage_ptr__);
    }
    else {
      impl::NumberStringBuilder::toUnicodeString(__return_storage_ptr__,&this->fResults->string);
    }
  }
  else {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b5258;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString FormattedNumber::toString(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return ICU_Utility::makeBogusString();
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return ICU_Utility::makeBogusString();
    }
    return fResults->string.toUnicodeString();
}